

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

iterator * __thiscall
immutable::transient_vector<int,_false,_6>::end
          (iterator *__return_storage_ptr__,transient_vector<int,_false,_6> *this)

{
  ref<immutable::rrb<int,_false,_6>_> local_20;
  transient_vector<int,_false,_6> *local_18;
  transient_vector<int,_false,_6> *this_local;
  
  local_18 = this;
  this_local = (transient_vector<int,_false,_6> *)__return_storage_ptr__;
  ref<immutable::rrb<int,false,6>>::ref<immutable::transient_rrb<int,false,6>>
            ((ref<immutable::rrb<int,false,6>> *)&local_20,&this->_impl);
  vector_iterator<int,_false,_6>::vector_iterator
            (__return_storage_ptr__,(ref<immutable::rrb<int,false,6>> *)&local_20);
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_20);
  return __return_storage_ptr__;
}

Assistant:

iterator end() const
        {
        return iterator((const ref<rrb<T, atomic_ref_counting, N>>&)_impl, typename iterator::end_type());
        }